

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O3

void maxHeapify(double *heap_v,HighsInt *heap_i,HighsInt i,HighsInt n)

{
  double dVar1;
  double dVar2;
  HighsInt HVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  uVar4 = (ulong)i;
  dVar1 = heap_v[uVar4];
  HVar3 = heap_i[uVar4];
  do {
    uVar4 = (ulong)(uint)((int)uVar4 * 2);
    do {
      iVar6 = (int)uVar4;
      if (n < iVar6) {
LAB_00379a5c:
        iVar6 = (int)(uVar4 >> 0x1f) + (int)uVar4 >> 1;
        heap_v[iVar6] = dVar1;
        heap_i[iVar6] = HVar3;
        return;
      }
      lVar5 = (long)iVar6;
      if ((iVar6 < n) && (heap_v[lVar5] <= heap_v[lVar5 + 1] && heap_v[lVar5 + 1] != heap_v[lVar5]))
      {
        uVar4 = (ulong)(iVar6 + 1);
        lVar5 = lVar5 + 1;
      }
      dVar2 = heap_v[lVar5];
      if (dVar2 < dVar1) goto LAB_00379a5c;
    } while (dVar2 < dVar1);
    iVar6 = (int)(uVar4 >> 0x1f) + (int)uVar4 >> 1;
    heap_v[iVar6] = dVar2;
    heap_i[iVar6] = heap_i[lVar5];
  } while( true );
}

Assistant:

void maxHeapify(double* heap_v, HighsInt* heap_i, HighsInt i, HighsInt n) {
  double temp_v;
  HighsInt j, temp_i;
  temp_v = heap_v[i];
  temp_i = heap_i[i];
  j = 2 * i;
  while (j <= n) {
    if (j < n && heap_v[j + 1] > heap_v[j]) j = j + 1;
    if (temp_v > heap_v[j])
      break;
    else if (temp_v <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = 2 * j;
    }
  }
  heap_v[j / 2] = temp_v;
  heap_i[j / 2] = temp_i;
  return;
}